

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void prepare_coeffs_12taps(InterpFilterParams *filter_params,int subpel_q4,__m256i *coeffs)

{
  undefined8 uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int16_t *piVar8;
  undefined1 (*in_RDX) [32];
  uint in_ESI;
  InterpFilterParams *in_RDI;
  __m256i coeff;
  __m128i coeff_8;
  int16_t *filter;
  undefined8 local_40;
  undefined8 uStack_38;
  
  piVar8 = av1_get_interp_filter_subpel_kernel(in_RDI,in_ESI & 0xf);
  auVar2._8_8_ = uStack_38;
  auVar2._0_8_ = local_40;
  auVar2._16_8_ = local_40;
  auVar2._24_8_ = uStack_38;
  auVar2 = vpshufd_avx2(auVar2,0);
  *in_RDX = auVar2;
  auVar3._8_8_ = uStack_38;
  auVar3._0_8_ = local_40;
  auVar3._16_8_ = local_40;
  auVar3._24_8_ = uStack_38;
  auVar2 = vpshufd_avx2(auVar3,0x55);
  in_RDX[1] = auVar2;
  auVar4._8_8_ = uStack_38;
  auVar4._0_8_ = local_40;
  auVar4._16_8_ = local_40;
  auVar4._24_8_ = uStack_38;
  auVar2 = vpshufd_avx2(auVar4,0xaa);
  in_RDX[2] = auVar2;
  auVar5._8_8_ = uStack_38;
  auVar5._0_8_ = local_40;
  auVar5._16_8_ = local_40;
  auVar5._24_8_ = uStack_38;
  auVar2 = vpshufd_avx2(auVar5,0xff);
  in_RDX[3] = auVar2;
  uVar1 = *(undefined8 *)(piVar8 + 8);
  auVar6._8_8_ = uVar1;
  auVar6._0_8_ = uVar1;
  auVar6._16_8_ = uVar1;
  auVar6._24_8_ = uVar1;
  auVar2 = vpshufd_avx2(auVar6,0);
  in_RDX[4] = auVar2;
  auVar7._8_8_ = uVar1;
  auVar7._0_8_ = uVar1;
  auVar7._16_8_ = uVar1;
  auVar7._24_8_ = uVar1;
  auVar2 = vpshufd_avx2(auVar7,0x55);
  in_RDX[5] = auVar2;
  return;
}

Assistant:

static inline void prepare_coeffs_12taps(
    const InterpFilterParams *const filter_params, const int subpel_q4,
    __m256i *const coeffs /* [4] */) {
  const int16_t *filter = av1_get_interp_filter_subpel_kernel(
      filter_params, subpel_q4 & SUBPEL_MASK);

  __m128i coeff_8 = _mm_loadu_si128((__m128i *)filter);
  __m256i coeff = _mm256_broadcastsi128_si256(coeff_8);

  // coeffs 0 1 0 1 0 1 0 1
  coeffs[0] = _mm256_shuffle_epi32(coeff, 0x00);
  // coeffs 2 3 2 3 2 3 2 3
  coeffs[1] = _mm256_shuffle_epi32(coeff, 0x55);
  // coeffs 4 5 4 5 4 5 4 5
  coeffs[2] = _mm256_shuffle_epi32(coeff, 0xaa);
  // coeffs 6 7 6 7 6 7 6 7
  coeffs[3] = _mm256_shuffle_epi32(coeff, 0xff);
  // coeffs 8 9 10 11 0 0 0 0
  coeff_8 = _mm_loadl_epi64((__m128i *)(filter + 8));
  coeff = _mm256_broadcastq_epi64(coeff_8);
  coeffs[4] = _mm256_shuffle_epi32(coeff, 0x00);  // coeffs 8 9 8 9 8 9 8 9
  coeffs[5] = _mm256_shuffle_epi32(coeff, 0x55);  // coeffs 10 11 10 11.. 10 11
}